

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall MeterPrivate::drawNeedle(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  DrawParams *pDVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  QBrush local_d8 [8];
  QColor local_d0;
  QColor local_c0;
  QRadialGradient local_b0 [8];
  QRadialGradient gradient;
  QBrush local_50 [4];
  float c;
  QBrush local_38 [8];
  QPen local_30 [8];
  double local_28;
  qreal r;
  DrawParams *params_local;
  QPainter *painter_local;
  MeterPrivate *this_local;
  
  local_28 = (double)this->radius / 10.0;
  r = (qreal)params;
  params_local = (DrawParams *)painter;
  painter_local = (QPainter *)this;
  QPainter::save();
  QPainter::translate((QPainter *)params_local,(double)this->radius,(double)this->radius);
  QPainter::rotate(*(double *)((long)r + 0x28) +
                   (*(double *)((long)r + 0x20) * this->value) / (this->maxValue - this->minValue));
  pDVar1 = params_local;
  QBrush::QBrush(local_38,&this->needleColor);
  QPen::QPen((QPen *)((double)this->radius / 75.0),local_30,local_38,1,0x10,0x40);
  QPainter::setPen((QPen *)pDVar1);
  QPen::~QPen(local_30);
  QBrush::~QBrush(local_38);
  QPainter::drawLine((QPainter *)params_local,0,
                     (int)((double)this->radius - *(double *)((long)r + 0x30)),0,
                     (int)-(local_28 + local_28));
  pDVar1 = params_local;
  QBrush::QBrush(local_50,&this->backgroundColor,1);
  QPainter::setBrush((QBrush *)pDVar1);
  QBrush::~QBrush(local_50);
  QPainter::setPen((PenStyle)params_local);
  QPainter::drawEllipse
            ((QPainter *)params_local,(int)-local_28,(int)-local_28,(int)(local_28 + local_28),
             (int)(local_28 + local_28));
  QPainter::restore();
  QPainter::save();
  fVar2 = (float)QColor::redF();
  fVar3 = (float)QColor::greenF();
  fVar4 = (float)QColor::blueF();
  QPainter::translate((QPainter *)params_local,(double)this->radius,(double)this->radius);
  QRadialGradient::QRadialGradient(local_b0,0.0,0.0,local_28,local_28,local_28);
  if (1.0 <= fVar2 + fVar3 + fVar4) {
    QGradient::setColorAt(1.0,(QColor *)local_b0);
    QColor::QColor(&local_d0,transparent);
    QGradient::setColorAt(0.0,(QColor *)local_b0);
  }
  else {
    QGradient::setColorAt(0.0,(QColor *)local_b0);
    QColor::QColor(&local_c0,transparent);
    QGradient::setColorAt(1.0,(QColor *)local_b0);
  }
  pDVar1 = params_local;
  QBrush::QBrush(local_d8,(QGradient *)local_b0);
  QPainter::setBrush((QBrush *)pDVar1);
  QBrush::~QBrush(local_d8);
  QPainter::setPen((PenStyle)params_local);
  QPainter::drawEllipse
            ((QPainter *)params_local,(int)-local_28,(int)-local_28,(int)(local_28 + local_28),
             (int)(local_28 + local_28));
  QPainter::restore();
  QRadialGradient::~QRadialGradient(local_b0);
  return;
}

Assistant:

void
MeterPrivate::drawNeedle( QPainter & painter, DrawParams & params )
{
	const qreal r = radius / 10.0;

	painter.save();
	painter.translate( radius, radius );
	painter.rotate( params.startScaleAngle + params.scaleDegree * value / ( maxValue - minValue ) );
	painter.setPen( QPen( needleColor, radius / 75.0 ) );
	painter.drawLine( 0, radius - params.margin, 0, - ( r * 2.0 ) );
	painter.setBrush( backgroundColor );
	painter.setPen( Qt::NoPen );
	painter.drawEllipse( -r, -r, r * 2.0, r * 2.0 );
	painter.restore();

	painter.save();
	const auto c = backgroundColor.redF() + backgroundColor.greenF() + backgroundColor.blueF();
	painter.translate( radius, radius );
	QRadialGradient gradient( 0.0, 0.0, r, r, r );

	if( c < 1.0 )
	{
		gradient.setColorAt( 0.0, textColor );
		gradient.setColorAt( 1.0, Qt::transparent );
	}
	else
	{
		gradient.setColorAt( 1.0, textColor );
		gradient.setColorAt( 0.0, Qt::transparent );
	}

	painter.setBrush( gradient );
	painter.setPen( Qt::NoPen );
	painter.drawEllipse( -r, -r, r * 2.0, r * 2.0 );
	painter.restore();
}